

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

int32_t zng_gzputs(gzFile file,char *s)

{
  char *msg;
  char *pcVar1;
  gz_state *in_RSI;
  gz_state *in_RDI;
  gz_state *state;
  size_t put;
  size_t len;
  int32_t local_34;
  size_t in_stack_ffffffffffffffd8;
  int32_t local_4;
  
  if (in_RDI == (gz_state *)0x0) {
    local_4 = -1;
  }
  else if ((in_RDI->mode == 0x79b1) && (in_RDI->err == 0)) {
    msg = (char *)strlen((char *)in_RSI);
    if (((int)msg < 0) || ((char *)((ulong)msg & 0xffffffff) != msg)) {
      gz_error(in_RDI,(int)((ulong)in_RSI >> 0x20),msg);
      local_4 = -1;
    }
    else {
      pcVar1 = (char *)gz_write(in_RSI,msg,in_stack_ffffffffffffffd8);
      if (pcVar1 < msg) {
        local_34 = -1;
      }
      else {
        local_34 = (int32_t)msg;
      }
      local_4 = local_34;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int Z_EXPORT PREFIX(gzputs)(gzFile file, const char *s) {
    size_t len, put;
    gz_state *state;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_state *)file;

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return -1;

    /* write string */
    len = strlen(s);
    if ((int)len < 0 || (unsigned)len != len) {
        gz_error(state, Z_STREAM_ERROR, "string length does not fit in int");
        return -1;
    }
    put = gz_write(state, s, len);
    return put < len ? -1 : (int)len;
}